

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O1

void __thiscall
InProcNativeEntryPointData::InProcNativeEntryPointData(InProcNativeEntryPointData *this)

{
  (this->super_NativeEntryPointData).xdataInfo.ptr = (XDataAllocation *)0x0;
  (this->super_NativeEntryPointData).propertyGuardCount = 0;
  (this->super_NativeEntryPointData).equivalentTypeCacheCount = 0;
  (this->super_NativeEntryPointData).registeredEquivalentTypeCacheRef.ptr = (EntryPointInfo **)0x0;
  (this->super_NativeEntryPointData).nativeThrowSpanSequence = (Type)0x0;
  (this->super_NativeEntryPointData).propertyGuardWeakRefs.ptr =
       (WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)0x0;
  (this->super_NativeEntryPointData).equivalentTypeCaches.ptr = (EquivalentTypeCache *)0x0;
  (this->super_NativeEntryPointData).polymorphicInlineCacheInfo.ptr =
       (EntryPointPolymorphicInlineCacheInfo *)0x0;
  (this->super_NativeEntryPointData).runtimeTypeRefs.ptr = (WriteBarrierPtr<void> *)0x0;
  (this->super_NativeEntryPointData).sharedPropertyGuards.ptr =
       (BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->super_NativeEntryPointData).constructorCaches.ptr =
       (SListCounted<Js::ConstructorCache_*,_Memory::Recycler> *)0x0;
  (this->super_NativeEntryPointData).jitTransferData.ptr = (JitTransferData *)0x0;
  (this->super_NativeEntryPointData).weakFuncRefSet.ptr =
       (BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->super_NativeEntryPointData).codeSize = 0;
  (this->super_NativeEntryPointData).validationCookie.ptr = (void *)0x0;
  (this->super_NativeEntryPointData).nativeAddress = (Type)0x0;
  (this->super_NativeEntryPointData).thunkAddress = (Type)0x0;
  (this->super_NativeEntryPointData).nativeOffsetMaps.
  super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>.
  buffer = (Type)0x0;
  (this->super_NativeEntryPointData).nativeOffsetMaps.
  super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>.
  count = 0;
  (this->super_NativeEntryPointData).nativeOffsetMaps.
  super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>.
  alloc = &Memory::HeapAllocator::Instance;
  (this->super_NativeEntryPointData).nativeOffsetMaps.
  super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ed3c8;
  (this->super_NativeEntryPointData).nativeOffsetMaps.length = 0;
  (this->super_NativeEntryPointData).nativeOffsetMaps.increment = 4;
  this->nativeCodeData = (Type)0x0;
  this->inlineeFrameMap = (Type)0x0;
  this->sortedLazyBailoutRecordList = (Type)0x0;
  this->lazyBailOutRecordSlotOffset = 0;
  this->lazyBailOutThunkOffset = 0;
  return;
}

Assistant:

InProcNativeEntryPointData::InProcNativeEntryPointData() :
    nativeCodeData(nullptr), inlineeFrameMap(nullptr), sortedLazyBailoutRecordList(nullptr),
    lazyBailOutRecordSlotOffset{0}, lazyBailOutThunkOffset{0}
#if !FLOATVAR
    , numberChunks(nullptr)
#endif
{
    Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
}